

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cs.c
# Opt level: O2

void cs_free(cs_insn *insn,size_t count)

{
  cs_detail **ppcVar1;
  bool bVar2;
  
  ppcVar1 = &insn->detail;
  while( true ) {
    bVar2 = count == 0;
    count = count - 1;
    if (bVar2) break;
    (*cs_mem_free)(*ppcVar1);
    ppcVar1 = ppcVar1 + 0x1e;
  }
  (*cs_mem_free)(insn);
  return;
}

Assistant:

CAPSTONE_API cs_free(cs_insn *insn, size_t count)
{
	size_t i;

	// free all detail pointers
	for (i = 0; i < count; i++)
		cs_mem_free(insn[i].detail);

	// then free pointer to cs_insn array
	cs_mem_free(insn);
}